

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseLast(ExtensionSet *this,int number)

{
  int iVar1;
  int iVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  Rep *pRVar4;
  MessageLite *pMVar5;
  Extension *pEVar6;
  LogMessage *pLVar7;
  LogFinisher local_49;
  LogMessage local_48;
  
  pEVar6 = FindOrNull(this,number);
  if (pEVar6 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
               ,0x346);
    pLVar7 = LogMessage::operator<<(&local_48,"CHECK failed: extension != NULL: ");
    pLVar7 = LogMessage::operator<<(pLVar7,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_49,pLVar7);
    LogMessage::~LogMessage(&local_48);
  }
  pRVar3 = (pEVar6->field_0).repeated_string_value;
  pRVar4 = (pRVar3->super_RepeatedPtrFieldBase).rep_;
  iVar1 = (pRVar3->super_RepeatedPtrFieldBase).current_size_;
  (pRVar3->super_RepeatedPtrFieldBase).current_size_ = iVar1 + -1;
  pMVar5 = (MessageLite *)pRVar4->elements[(long)iVar1 + -1];
  iVar2 = pRVar4->allocated_size;
  pRVar4->allocated_size = iVar2 + -1;
  if (iVar1 < iVar2) {
    pRVar4->elements[(long)iVar1 + -1] = pRVar4->elements[(long)iVar2 + -1];
  }
  return pMVar5;
}

Assistant:

MessageLite* ExtensionSet::ReleaseLast(int number) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK(extension->is_repeated);
  GOOGLE_DCHECK(cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE);
  return extension->repeated_message_value->ReleaseLast();
}